

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2latlng_rect.cc
# Opt level: O2

S1Angle S2LatLngRect::GetDirectedHausdorffDistance(double lng_diff,R1Interval *a,R1Interval *b)

{
  S1Angle SVar1;
  S1Angle SVar2;
  S1Angle SVar3;
  VType VVar4;
  S1Angle SVar5;
  S2Point b_lo;
  R1Interval local_a0;
  S2Point local_90;
  S2Point b_hi;
  S2Point a_hi;
  S2Point a_lo;
  
  if (lng_diff < 0.0) {
    S2LogMessage::S2LogMessage
              ((S2LogMessage *)&b_lo,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2latlng_rect.cc"
               ,0x26b,kFatal,(ostream *)&std::cerr);
    std::operator<<((ostream *)b_lo.c_[1],"Check failed: (lng_diff) >= (0) ");
  }
  else {
    if (lng_diff <= 3.141592653589793) {
      if ((lng_diff == 0.0) && (!NAN(lng_diff))) {
        SVar1.radians_ = R1Interval::GetDirectedHausdorffDistance(a,b);
        return (S1Angle)SVar1.radians_;
      }
      b_hi.c_[0] = (b->bounds_).c_[0];
      b_hi.c_[1] = lng_diff;
      S2LatLng::ToPoint(&b_lo,(S2LatLng *)&b_hi);
      a_lo.c_[0] = (b->bounds_).c_[1];
      a_lo.c_[1] = lng_diff;
      S2LatLng::ToPoint(&b_hi,(S2LatLng *)&a_lo);
      a_hi.c_[0] = (a->bounds_).c_[0];
      a_hi.c_[1] = 0.0;
      S2LatLng::ToPoint(&a_lo,(S2LatLng *)&a_hi);
      local_90.c_[0] = (a->bounds_).c_[1];
      local_90.c_[1] = 0.0;
      S2LatLng::ToPoint(&a_hi,(S2LatLng *)&local_90);
      SVar2 = S2::GetDistance(&a_lo,&b_lo,&b_hi);
      SVar1 = S2::GetDistance(&a_hi,&b_lo,&b_hi);
      if (SVar1.radians_ <= SVar2.radians_) {
        SVar1 = SVar2;
      }
      if (lng_diff <= 1.5707963267948966) {
        SVar2.radians_ = SVar1.radians_;
        if (((((a->bounds_).c_[0] <= 0.0) && (0.0 <= (a->bounds_).c_[1])) &&
            ((b->bounds_).c_[0] <= 0.0)) &&
           ((0.0 <= (b->bounds_).c_[1] && (SVar2.radians_ = lng_diff, lng_diff <= SVar1.radians_))))
        {
          SVar2.radians_ = SVar1.radians_;
        }
      }
      else {
        GetBisectorIntersection(&local_90,b,lng_diff);
        SVar3 = S2LatLng::Latitude(&local_90);
        VVar4 = (a->bounds_).c_[0];
        local_a0.bounds_.c_[1] = (a->bounds_).c_[1];
        if ((VVar4 <= SVar3.radians_) && (SVar3.radians_ <= local_a0.bounds_.c_[1])) {
          S1Angle::S1Angle((S1Angle *)&local_a0,&local_90,&b_lo);
          if (local_a0.bounds_.c_[0] <= SVar1.radians_) {
            local_a0.bounds_.c_[0] = SVar1.radians_;
          }
          VVar4 = (a->bounds_).c_[0];
          local_a0.bounds_.c_[1] = (a->bounds_).c_[1];
          SVar1.radians_ = local_a0.bounds_.c_[0];
        }
        SVar5.radians_ = SVar1.radians_;
        if (VVar4 < SVar3.radians_) {
          if (SVar3.radians_ <= local_a0.bounds_.c_[1]) {
            local_a0.bounds_.c_[1] = (VType)SVar3;
          }
          local_a0.bounds_.c_[0] = VVar4;
          SVar5 = GetInteriorMaxDistance(&local_a0,&b_lo);
          if (SVar5.radians_ <= SVar1.radians_) {
            SVar5.radians_ = SVar1.radians_;
          }
          local_a0.bounds_.c_[1] = (a->bounds_).c_[1];
        }
        SVar2.radians_ = SVar5.radians_;
        if (SVar3.radians_ < local_a0.bounds_.c_[1]) {
          local_a0.bounds_.c_[0] = (a->bounds_).c_[0];
          if (local_a0.bounds_.c_[0] <= SVar3.radians_) {
            local_a0.bounds_.c_[0] = (VType)SVar3;
          }
          SVar2 = GetInteriorMaxDistance(&local_a0,&b_hi);
          if (SVar2.radians_ <= SVar5.radians_) {
            SVar2.radians_ = SVar5.radians_;
          }
        }
      }
      return (S1Angle)SVar2.radians_;
    }
    S2LogMessage::S2LogMessage
              ((S2LogMessage *)&b_lo,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2latlng_rect.cc"
               ,0x26c,kFatal,(ostream *)&std::cerr);
    std::operator<<((ostream *)b_lo.c_[1],"Check failed: (lng_diff) <= (3.14159265358979323846) ");
  }
  abort();
}

Assistant:

S1Angle S2LatLngRect::GetDirectedHausdorffDistance(
    double lng_diff, const R1Interval& a, const R1Interval& b) {
  // By symmetry, we can assume a's longtitude is 0 and b's longtitude is
  // lng_diff. Call b's two endpoints b_lo and b_hi. Let H be the hemisphere
  // containing a and delimited by the longitude line of b. The Voronoi diagram
  // of b on H has three edges (portions of great circles) all orthogonal to b
  // and meeting at b_lo cross b_hi.
  // E1: (b_lo, b_lo cross b_hi)
  // E2: (b_hi, b_lo cross b_hi)
  // E3: (-b_mid, b_lo cross b_hi), where b_mid is the midpoint of b
  //
  // They subdivide H into three Voronoi regions. Depending on how longitude 0
  // (which contains edge a) intersects these regions, we distinguish two cases:
  // Case 1: it intersects three regions. This occurs when lng_diff <= M_PI_2.
  // Case 2: it intersects only two regions. This occurs when lng_diff > M_PI_2.
  //
  // In the first case, the directed Hausdorff distance to edge b can only be
  // realized by the following points on a:
  // A1: two endpoints of a.
  // A2: intersection of a with the equator, if b also intersects the equator.
  //
  // In the second case, the directed Hausdorff distance to edge b can only be
  // realized by the following points on a:
  // B1: two endpoints of a.
  // B2: intersection of a with E3
  // B3: farthest point from b_lo to the interior of D, and farthest point from
  //     b_hi to the interior of U, if any, where D (resp. U) is the portion
  //     of edge a below (resp. above) the intersection point from B2.

  S2_DCHECK_GE(lng_diff, 0);
  S2_DCHECK_LE(lng_diff, M_PI);

  if (lng_diff == 0) {
    return S1Angle::Radians(a.GetDirectedHausdorffDistance(b));
  }

  // Assumed longtitude of b.
  double b_lng = lng_diff;
  // Two endpoints of b.
  S2Point b_lo = S2LatLng::FromRadians(b.lo(), b_lng).ToPoint();
  S2Point b_hi = S2LatLng::FromRadians(b.hi(), b_lng).ToPoint();

  // Handling of each case outlined at the top of the function starts here.
  // This is initialized a few lines below.
  S1Angle max_distance;

  // Cases A1 and B1.
  S2Point a_lo = S2LatLng::FromRadians(a.lo(), 0).ToPoint();
  S2Point a_hi = S2LatLng::FromRadians(a.hi(), 0).ToPoint();
  max_distance = S2::GetDistance(a_lo, b_lo, b_hi);
  max_distance = max(
      max_distance, S2::GetDistance(a_hi, b_lo, b_hi));

  if (lng_diff <= M_PI_2) {
    // Case A2.
    if (a.Contains(0) && b.Contains(0)) {
      max_distance = max(max_distance, S1Angle::Radians(lng_diff));
    }
  } else {
    // Case B2.
    const S2Point& p = GetBisectorIntersection(b, b_lng);
    double p_lat = S2LatLng::Latitude(p).radians();
    if (a.Contains(p_lat)) {
      max_distance = max(max_distance, S1Angle(p, b_lo));
    }

    // Case B3.
    if (p_lat > a.lo()) {
      max_distance = max(max_distance, GetInteriorMaxDistance(
          R1Interval(a.lo(), min(p_lat, a.hi())), b_lo));
    }
    if (p_lat < a.hi()) {
      max_distance = max(max_distance, GetInteriorMaxDistance(
          R1Interval(max(p_lat, a.lo()), a.hi()), b_hi));
    }
  }

  return max_distance;
}